

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall BBDT<UF>::PerformLabeling(BBDT<UF> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  uint *puVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  uint local_e0;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar26 = *(uint *)&pMVar4->field_0x8;
  uVar12 = (ulong)uVar26;
  iVar17 = *(int *)&pMVar4->field_0xc;
  lVar24 = (long)iVar17;
  cv::Mat::Mat(local_90,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  uVar15 = 1;
  if (0 < (int)uVar26) {
    uVar16 = 0;
    do {
      if (0 < iVar17) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar18 = **(long **)&pMVar4->field_0x48;
        lVar20 = lVar18 * uVar16 + *(long *)&pMVar4->field_0x10;
        lVar22 = lVar20 - lVar18;
        lVar29 = lVar22 - lVar18;
        lVar27 = **(long **)&pMVar5->field_0x48;
        lVar23 = lVar27 * uVar16 + *(long *)&pMVar5->field_0x10;
        lVar18 = lVar18 + lVar20;
        lVar27 = lVar23 + lVar27 * -2;
        uVar14 = uVar16 | 1;
        uVar11 = 0;
        do {
          puVar19 = UF::P_;
          if (*(char *)(lVar20 + uVar11) == '\0') {
            if ((uVar14 < uVar12) && (*(char *)(lVar18 + uVar11) != '\0')) {
              uVar9 = uVar11 | 1;
              if ((lVar24 <= (long)uVar9) || (*(char *)(lVar20 + uVar9) == '\0')) {
                if ((uVar11 == 0) ||
                   ((*(char *)((uVar11 - 1) + lVar18) == '\0' &&
                    (*(char *)(lVar20 + -1 + uVar11) == '\0')))) goto LAB_001904a6;
                goto LAB_00191100;
              }
              if (uVar11 != 0) {
                if (*(char *)((uVar11 - 1) + lVar20) != '\0') {
                  if (uVar16 != 0) {
                    if (*(char *)(lVar22 + uVar9) == '\0') {
                      if (((long)(uVar11 + 2) < lVar24) && (*(char *)(lVar22 + uVar11 + 2) != '\0'))
                      {
                        if (*(char *)(lVar29 + uVar9) == '\0') {
                          uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                        else {
                          if (*(char *)(lVar22 + uVar11) != '\0') goto LAB_00191100;
                          if (*(char *)(lVar29 + uVar11) == '\0') {
                            uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                            do {
                              uVar28 = uVar26;
                              uVar9 = (ulong)uVar28;
                              uVar26 = UF::P_[uVar9];
                              uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                            } while (UF::P_[uVar9] < uVar28);
                            do {
                              uVar26 = uVar15;
                              uVar30 = (ulong)uVar26;
                              uVar15 = UF::P_[uVar30];
                            } while (UF::P_[uVar30] < uVar26);
                          }
                          else {
                            if (*(char *)(lVar22 + -1 + uVar11) != '\0') goto LAB_00191100;
                            if (*(char *)((uVar11 - 2) + lVar22) == '\0') {
                              uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                              do {
                                uVar28 = uVar26;
                                uVar9 = (ulong)uVar28;
                                uVar26 = UF::P_[uVar9];
                                uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                              } while (UF::P_[uVar9] < uVar28);
                              do {
                                uVar26 = uVar15;
                                uVar30 = (ulong)uVar26;
                                uVar15 = UF::P_[uVar30];
                              } while (UF::P_[uVar30] < uVar26);
                            }
                            else {
                              if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                              uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                              do {
                                uVar28 = uVar26;
                                uVar9 = (ulong)uVar28;
                                uVar26 = UF::P_[uVar9];
                                uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                              } while (UF::P_[uVar9] < uVar28);
                              do {
                                uVar26 = uVar15;
                                uVar30 = (ulong)uVar26;
                                uVar15 = UF::P_[uVar30];
                              } while (UF::P_[uVar30] < uVar26);
                            }
                          }
                        }
                        goto LAB_001913c0;
                      }
                    }
                    else if (*(char *)(lVar22 + uVar11) == '\0') {
                      if (*(char *)(lVar29 + uVar11) == '\0') {
                        uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else {
                        if (*(char *)(lVar22 + -1 + uVar11) != '\0') goto LAB_00191100;
                        if (*(char *)((uVar11 - 2) + lVar22) == '\0') {
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                        else {
                          if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                      }
                      goto LAB_001913c0;
                    }
                  }
                  goto LAB_00191100;
                }
                if (*(char *)(lVar18 + -1 + uVar11) != '\0') {
                  if (uVar16 == 0) goto LAB_00191100;
                  if (*(char *)(lVar22 + uVar9) == '\0') {
                    if (((long)(uVar11 + 2) < lVar24) && (*(char *)(lVar22 + uVar11 + 2) != '\0')) {
                      if (*(char *)(lVar29 + uVar9) == '\0') {
                        if (*(char *)(lVar22 + uVar11) != '\0') {
                          if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                            uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                            do {
                              uVar28 = uVar26;
                              uVar26 = UF::P_[uVar28];
                              uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                            } while (UF::P_[uVar28] < uVar28);
                            do {
                              uVar26 = uVar15;
                              uVar15 = UF::P_[uVar26];
                            } while (UF::P_[uVar26] < uVar26);
                            if (uVar28 < uVar26) {
                              UF::P_[uVar26] = uVar28;
                              uVar26 = uVar28;
                            }
                            else {
                              UF::P_[uVar28] = uVar26;
                            }
                            do {
                              uVar15 = uVar26;
                              uVar9 = (ulong)uVar15;
                              uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                              uVar26 = puVar19[uVar9];
                            } while (puVar19[uVar9] < uVar15);
                            do {
                              uVar26 = uVar28;
                              uVar30 = (ulong)uVar26;
                              uVar28 = puVar19[uVar30];
                            } while (puVar19[uVar30] < uVar26);
                          }
                          else {
                            if (*(char *)(lVar22 + -1 + uVar11) != '\0') {
                              uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                              do {
                                uVar28 = uVar26;
                                uVar9 = (ulong)uVar28;
                                uVar26 = UF::P_[uVar9];
                                uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                              } while (UF::P_[uVar9] < uVar28);
                              do {
                                uVar26 = uVar15;
                                uVar30 = (ulong)uVar26;
                                uVar15 = UF::P_[uVar30];
                              } while (UF::P_[uVar30] < uVar26);
                              goto LAB_001913c0;
                            }
                            if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                              uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                              do {
                                uVar28 = uVar26;
                                uVar26 = UF::P_[uVar28];
                                uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                              } while (UF::P_[uVar28] < uVar28);
                              do {
                                uVar26 = uVar15;
                                uVar15 = UF::P_[uVar26];
                              } while (UF::P_[uVar26] < uVar26);
                              if (uVar28 < uVar26) {
                                UF::P_[uVar26] = uVar28;
                                uVar26 = uVar28;
                              }
                              else {
                                UF::P_[uVar28] = uVar26;
                              }
                              do {
                                uVar15 = uVar26;
                                uVar9 = (ulong)uVar15;
                                uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                                uVar26 = puVar19[uVar9];
                              } while (puVar19[uVar9] < uVar15);
                              do {
                                uVar26 = uVar28;
                                uVar30 = (ulong)uVar26;
                                uVar28 = puVar19[uVar30];
                              } while (puVar19[uVar30] < uVar26);
                            }
                            else {
                              if (*(char *)(lVar29 + -1 + uVar11) != '\0') {
                                uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                                do {
                                  uVar28 = uVar26;
                                  uVar9 = (ulong)uVar28;
                                  uVar26 = UF::P_[uVar9];
                                  uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                                } while (UF::P_[uVar9] < uVar28);
                                do {
                                  uVar26 = uVar15;
                                  uVar30 = (ulong)uVar26;
                                  uVar15 = UF::P_[uVar30];
                                } while (UF::P_[uVar30] < uVar26);
                                goto LAB_0019093b;
                              }
                              uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                              do {
                                uVar28 = uVar26;
                                uVar26 = UF::P_[uVar28];
                                uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                              } while (UF::P_[uVar28] < uVar28);
                              do {
                                uVar26 = uVar15;
                                uVar15 = UF::P_[uVar26];
                              } while (UF::P_[uVar26] < uVar26);
                              if (uVar28 < uVar26) {
                                UF::P_[uVar26] = uVar28;
                                uVar26 = uVar28;
                              }
                              else {
                                UF::P_[uVar28] = uVar26;
                              }
                              do {
                                uVar15 = uVar26;
                                uVar9 = (ulong)uVar15;
                                uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                                uVar26 = puVar19[uVar9];
                              } while (puVar19[uVar9] < uVar15);
                              do {
                                uVar26 = uVar28;
                                uVar30 = (ulong)uVar26;
                                uVar28 = puVar19[uVar30];
                              } while (puVar19[uVar30] < uVar26);
                            }
                          }
                          goto LAB_00191365;
                        }
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                        if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                          uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                        else if (*(char *)(lVar29 + -1 + uVar11) == '\0') {
                          uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                        else {
                          if ((*(char *)(lVar22 + uVar11) != '\0') ||
                             (*(char *)(lVar29 + uVar11) != '\0')) goto LAB_00191100;
                          uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                      }
                      else {
                        if ((*(char *)(lVar22 + uVar11) != '\0') ||
                           (*(char *)(lVar29 + uVar11) != '\0')) goto LAB_00191100;
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                    }
                    else {
                      if (*(char *)(lVar22 + uVar11) == '\0') goto LAB_00191100;
                      if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                        uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else {
                        if (*(char *)(lVar22 + -1 + uVar11) != '\0') goto LAB_00191100;
                        if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                        else {
                          if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                        }
                      }
                    }
                  }
                  else if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                    uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  else if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                    if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else if (*(char *)(lVar29 + -1 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else {
                      if ((*(char *)(lVar22 + uVar11) != '\0') ||
                         (*(char *)(lVar29 + uVar11) != '\0')) goto LAB_00191100;
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                  }
                  else {
                    if ((*(char *)(lVar22 + uVar11) != '\0') || (*(char *)(lVar29 + uVar11) != '\0')
                       ) goto LAB_00191100;
                    uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  goto LAB_001913c0;
                }
              }
              if (uVar16 == 0) goto LAB_001904a6;
              if (*(char *)(lVar22 + uVar9) == '\0') {
                if (((long)(uVar11 + 2) < lVar24) && (*(char *)(lVar22 + uVar11 + 2) != '\0')) {
                  if ((*(char *)(lVar22 + uVar11) != '\0') && (*(char *)(lVar29 + uVar9) == '\0')) {
                    uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                    goto LAB_001913c0;
                  }
                  goto LAB_001904e1;
                }
LAB_00190495:
                if (*(char *)(lVar22 + uVar11) == '\0') goto LAB_001904a6;
              }
LAB_0019049c:
              uVar7 = *(undefined4 *)(lVar27 + uVar11 * 4);
LAB_00191105:
              *(undefined4 *)(lVar23 + uVar11 * 4) = uVar7;
            }
            else {
              uVar9 = uVar11 | 1;
              if ((long)uVar9 < lVar24) {
                if (*(char *)(lVar20 + uVar9) == '\0') {
                  if ((uVar12 <= uVar14) || (*(char *)(lVar18 + uVar9) == '\0')) goto LAB_0019025a;
                }
                else if (uVar16 != 0) {
                  if (*(char *)(lVar22 + uVar9) == '\0') {
                    if ((lVar24 <= (long)(uVar11 + 2)) || (*(char *)(lVar22 + uVar11 + 2) == '\0'))
                    goto LAB_00190495;
                    if ((*(char *)(lVar22 + uVar11) != '\0') && (*(char *)(lVar29 + uVar9) == '\0'))
                    {
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                      goto LAB_001913c0;
                    }
                    goto LAB_001904e1;
                  }
                  goto LAB_0019049c;
                }
                goto LAB_001904a6;
              }
LAB_0019025a:
              *(undefined4 *)(lVar23 + uVar11 * 4) = 0;
            }
          }
          else if (uVar11 == 0) {
LAB_00190126:
            uVar9 = uVar11 | 1;
            if ((uVar16 != 0) && (((long)uVar9 < lVar24 && (*(char *)(lVar22 + uVar9) != '\0')))) {
              if ((*(char *)(lVar22 + uVar11) == '\0') &&
                 (((uVar11 != 0 && (*(char *)(lVar22 + -1 + uVar11) != '\0')) &&
                  (*(char *)(lVar29 + uVar11) == '\0')))) {
                uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                do {
                  uVar28 = uVar26;
                  uVar9 = (ulong)uVar28;
                  uVar26 = UF::P_[uVar9];
                  uVar15 = *(uint *)(lVar27 + uVar11 * 4);
                } while (UF::P_[uVar9] < uVar28);
                do {
                  uVar26 = uVar15;
                  uVar30 = (ulong)uVar26;
                  uVar15 = UF::P_[uVar30];
                } while (UF::P_[uVar30] < uVar26);
                goto LAB_001913c0;
              }
              goto LAB_0019049c;
            }
            if (((long)uVar9 < lVar24) && (*(char *)(lVar20 + uVar9) != '\0')) {
              if ((uVar16 == 0) || (lVar24 <= (long)(uVar11 + 2))) {
                if (uVar16 == 0) goto LAB_001904a6;
              }
              else if (*(char *)(lVar22 + uVar11 + 2) != '\0') {
                if (*(char *)(lVar22 + uVar11) == '\0') {
                  if ((uVar11 != 0) && (*(char *)(lVar22 + -1 + uVar11) != '\0')) {
                    if (*(char *)(lVar29 + uVar9) == '\0') {
                      uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else {
                      if (*(char *)(lVar29 + uVar11) != '\0') goto LAB_001904e1;
                      uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
LAB_001913c0:
                    if (uVar28 < uVar26) goto LAB_001913c4;
                    UF::P_[uVar9] = uVar26;
                    goto LAB_001913d0;
                  }
                }
                else if (*(char *)(lVar29 + uVar9) == '\0') {
                  uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                  do {
                    uVar28 = uVar26;
                    uVar9 = (ulong)uVar28;
                    uVar26 = UF::P_[uVar9];
                    uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                  } while (UF::P_[uVar9] < uVar28);
                  do {
                    uVar26 = uVar15;
                    uVar30 = (ulong)uVar26;
                    uVar15 = UF::P_[uVar30];
                  } while (UF::P_[uVar30] < uVar26);
                  goto LAB_001913c0;
                }
LAB_001904e1:
                uVar7 = *(undefined4 *)(lVar27 + 8 + uVar11 * 4);
                goto LAB_00191105;
              }
              if (*(char *)(lVar22 + uVar11) != '\0') goto LAB_0019049c;
              if (uVar16 != 0 && uVar11 != 0) {
LAB_0019028f:
                if (*(char *)(lVar22 + -1 + uVar11) != '\0') {
                  uVar7 = *(undefined4 *)(lVar27 + -8 + uVar11 * 4);
                  goto LAB_00191105;
                }
              }
            }
            else if (uVar16 != 0) {
              if (*(char *)(lVar22 + uVar11) != '\0') goto LAB_0019049c;
              if (uVar11 != 0) goto LAB_0019028f;
            }
LAB_001904a6:
            UF::P_[UF::length_] = UF::length_;
            uVar26 = UF::length_ + 1;
            *(uint *)(lVar23 + uVar11 * 4) = UF::length_;
            UF::length_ = uVar26;
          }
          else {
            if (*(char *)(lVar20 + -1 + uVar11) != '\0') {
              uVar9 = uVar11 | 1;
              if (((uVar16 == 0) || (lVar24 <= (long)uVar9)) || (*(char *)(lVar22 + uVar9) == '\0'))
              {
                if ((((long)uVar9 < lVar24) && (*(char *)(lVar20 + uVar9) != '\0')) &&
                   ((uVar16 != 0 &&
                    (((long)(uVar11 + 2) < lVar24 && (*(char *)(lVar22 + uVar11 + 2) != '\0')))))) {
                  if (*(char *)(lVar29 + uVar9) == '\0') {
                    uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  else {
                    if (*(char *)(lVar22 + uVar11) != '\0') goto LAB_00191100;
                    if (*(char *)(lVar29 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else {
                      if (*(char *)(lVar22 + -1 + uVar11) != '\0') goto LAB_00191100;
                      if (*(char *)((uVar11 - 2) + lVar22) == '\0') {
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else {
                        if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                    }
                  }
                  goto LAB_00190cc6;
                }
              }
              else if (*(char *)(lVar22 + uVar11) == '\0') {
                if (*(char *)(lVar29 + uVar11) == '\0') {
                  uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                  do {
                    uVar28 = uVar26;
                    uVar9 = (ulong)uVar28;
                    uVar26 = UF::P_[uVar9];
                    uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                  } while (UF::P_[uVar9] < uVar28);
                  do {
                    uVar26 = uVar15;
                    uVar30 = (ulong)uVar26;
                    uVar15 = UF::P_[uVar30];
                  } while (UF::P_[uVar30] < uVar26);
                }
                else {
                  if (*(char *)(lVar22 + -1 + uVar11) != '\0') goto LAB_00191100;
                  if (*(char *)((uVar11 - 2) + lVar22) == '\0') {
                    uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  else {
                    if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                    uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                }
                goto LAB_00190cc6;
              }
              goto LAB_00191100;
            }
            if ((uVar12 <= uVar14) || (*(char *)(lVar18 + -1 + uVar11) == '\0')) goto LAB_00190126;
            uVar9 = uVar11 | 1;
            if (((uVar16 == 0) || (lVar24 <= (long)uVar9)) || (*(char *)(lVar22 + uVar9) == '\0')) {
              if (((long)uVar9 < lVar24) && (*(char *)(lVar20 + uVar9) != '\0')) {
                if (((uVar16 != 0) && ((long)(uVar11 + 2) < lVar24)) &&
                   (*(char *)(lVar22 + uVar11 + 2) != '\0')) {
                  if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                    if (*(char *)(lVar22 + uVar11) == '\0') {
                      if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                        goto LAB_001913c0;
                      }
                      if (*(char *)(lVar29 + uVar9) == '\0') {
                        uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar26 = UF::P_[uVar28];
                          uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        } while (UF::P_[uVar28] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar15 = UF::P_[uVar26];
                        } while (UF::P_[uVar26] < uVar26);
                        if (uVar28 < uVar26) {
                          UF::P_[uVar26] = uVar28;
                          uVar26 = uVar28;
                        }
                        else {
                          UF::P_[uVar28] = uVar26;
                        }
                        do {
                          uVar15 = uVar26;
                          uVar9 = (ulong)uVar15;
                          uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          uVar26 = puVar19[uVar9];
                        } while (puVar19[uVar9] < uVar15);
                        do {
                          uVar26 = uVar28;
                          uVar30 = (ulong)uVar26;
                          uVar28 = puVar19[uVar30];
                        } while (puVar19[uVar30] < uVar26);
                      }
                      else {
                        if (*(char *)(lVar29 + uVar11) != '\0') {
                          uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar9 = (ulong)uVar28;
                            uVar26 = UF::P_[uVar9];
                            uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          } while (UF::P_[uVar9] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar30 = (ulong)uVar26;
                            uVar15 = UF::P_[uVar30];
                          } while (UF::P_[uVar30] < uVar26);
                          goto LAB_0019093b;
                        }
                        uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar26 = UF::P_[uVar28];
                          uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        } while (UF::P_[uVar28] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar15 = UF::P_[uVar26];
                        } while (UF::P_[uVar26] < uVar26);
                        if (uVar28 < uVar26) {
                          UF::P_[uVar26] = uVar28;
                          uVar26 = uVar28;
                        }
                        else {
                          UF::P_[uVar28] = uVar26;
                        }
                        do {
                          uVar15 = uVar26;
                          uVar9 = (ulong)uVar15;
                          uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                          uVar26 = puVar19[uVar9];
                        } while (puVar19[uVar9] < uVar15);
                        do {
                          uVar26 = uVar28;
                          uVar30 = (ulong)uVar26;
                          uVar28 = puVar19[uVar30];
                        } while (puVar19[uVar30] < uVar26);
                      }
                    }
                    else {
                      if (*(char *)(lVar29 + uVar9) != '\0') {
                        uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
LAB_0019093b:
                        if (uVar28 < uVar26) goto LAB_00190944;
                        UF::P_[uVar9] = uVar26;
                        goto LAB_00190cde;
                      }
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar26 = UF::P_[uVar28];
                        uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      } while (UF::P_[uVar28] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar15 = UF::P_[uVar26];
                      } while (UF::P_[uVar26] < uVar26);
                      if (uVar28 < uVar26) {
                        UF::P_[uVar26] = uVar28;
                        uVar26 = uVar28;
                      }
                      else {
                        UF::P_[uVar28] = uVar26;
                      }
                      do {
                        uVar15 = uVar26;
                        uVar9 = (ulong)uVar15;
                        uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        uVar26 = puVar19[uVar9];
                      } while (puVar19[uVar9] < uVar15);
                      do {
                        uVar26 = uVar28;
                        uVar30 = (ulong)uVar26;
                        uVar28 = puVar19[uVar30];
                      } while (puVar19[uVar30] < uVar26);
                    }
LAB_00191365:
                    if (uVar15 < uVar26) {
                      puVar19[uVar30] = uVar15;
                      uVar26 = uVar15;
                    }
                    else {
                      puVar19[uVar9] = uVar26;
                    }
                    *(uint *)(lVar23 + uVar11 * 4) = uVar26;
                    goto LAB_00191109;
                  }
                  if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                    if (*(char *)(lVar29 + uVar9) == '\0') {
                      if (*(char *)(lVar22 + uVar11) != '\0') {
                        if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar26 = UF::P_[uVar28];
                            uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          } while (UF::P_[uVar28] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar15 = UF::P_[uVar26];
                          } while (UF::P_[uVar26] < uVar26);
                          if (uVar28 < uVar26) {
                            UF::P_[uVar26] = uVar28;
                            uVar26 = uVar28;
                          }
                          else {
                            UF::P_[uVar28] = uVar26;
                          }
                          do {
                            uVar15 = uVar26;
                            uVar9 = (ulong)uVar15;
                            uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                            uVar26 = puVar19[uVar9];
                          } while (puVar19[uVar9] < uVar15);
                          do {
                            uVar26 = uVar28;
                            uVar30 = (ulong)uVar26;
                            uVar28 = puVar19[uVar30];
                          } while (puVar19[uVar30] < uVar26);
                        }
                        else {
                          if (*(char *)(lVar29 + -1 + uVar11) != '\0') {
                            uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                            do {
                              uVar28 = uVar26;
                              uVar9 = (ulong)uVar28;
                              uVar26 = UF::P_[uVar9];
                              uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                            } while (UF::P_[uVar9] < uVar28);
                            do {
                              uVar26 = uVar15;
                              uVar30 = (ulong)uVar26;
                              uVar15 = UF::P_[uVar30];
                            } while (UF::P_[uVar30] < uVar26);
                            goto LAB_0019093b;
                          }
                          uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                          do {
                            uVar28 = uVar26;
                            uVar26 = UF::P_[uVar28];
                            uVar15 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                          } while (UF::P_[uVar28] < uVar28);
                          do {
                            uVar26 = uVar15;
                            uVar15 = UF::P_[uVar26];
                          } while (UF::P_[uVar26] < uVar26);
                          if (uVar28 < uVar26) {
                            UF::P_[uVar26] = uVar28;
                            uVar26 = uVar28;
                          }
                          else {
                            UF::P_[uVar28] = uVar26;
                          }
                          do {
                            uVar15 = uVar26;
                            uVar9 = (ulong)uVar15;
                            uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                            uVar26 = puVar19[uVar9];
                          } while (puVar19[uVar9] < uVar15);
                          do {
                            uVar26 = uVar28;
                            uVar30 = (ulong)uVar26;
                            uVar28 = puVar19[uVar30];
                          } while (puVar19[uVar30] < uVar26);
                        }
                        goto LAB_00191365;
                      }
                      uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else if (*(char *)(lVar29 + -1 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else {
                      if ((*(char *)(lVar22 + uVar11) != '\0') ||
                         (*(char *)(lVar29 + uVar11) != '\0')) goto LAB_00191100;
                      uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                  }
                  else if (*(char *)(lVar29 + uVar9) == '\0') {
                    uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  else {
                    if ((*(char *)(lVar22 + uVar11) != '\0') || (*(char *)(lVar29 + uVar11) != '\0')
                       ) goto LAB_00191100;
                    uVar26 = *(uint *)(lVar27 + 8 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                  }
                  goto LAB_001913c0;
                }
                if (uVar16 != 0) {
                  if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                    if (*(char *)(lVar22 + uVar11) != '\0') {
                      if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                        uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                        uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      else {
                        if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                        uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                        do {
                          uVar28 = uVar26;
                          uVar9 = (ulong)uVar28;
                          uVar26 = UF::P_[uVar9];
                          uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                        } while (UF::P_[uVar9] < uVar28);
                        do {
                          uVar26 = uVar15;
                          uVar30 = (ulong)uVar26;
                          uVar15 = UF::P_[uVar30];
                        } while (UF::P_[uVar30] < uVar26);
                      }
                      goto LAB_001913c0;
                    }
                  }
                  else if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                    uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                    do {
                      uVar28 = uVar26;
                      uVar9 = (ulong)uVar28;
                      uVar26 = UF::P_[uVar9];
                      uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    } while (UF::P_[uVar9] < uVar28);
                    do {
                      uVar26 = uVar15;
                      uVar30 = (ulong)uVar26;
                      uVar15 = UF::P_[uVar30];
                    } while (UF::P_[uVar30] < uVar26);
                    goto LAB_001913c0;
                  }
                }
              }
              else if (uVar16 != 0) {
                if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                  if (*(char *)(lVar22 + uVar11) != '\0') {
                    if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    else {
                      if (*(char *)(lVar29 + -1 + uVar11) != '\0') goto LAB_00191100;
                      uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                      do {
                        uVar28 = uVar26;
                        uVar9 = (ulong)uVar28;
                        uVar26 = UF::P_[uVar9];
                        uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                      } while (UF::P_[uVar9] < uVar28);
                      do {
                        uVar26 = uVar15;
                        uVar30 = (ulong)uVar26;
                        uVar15 = UF::P_[uVar30];
                      } while (UF::P_[uVar30] < uVar26);
                    }
                    goto LAB_001913c0;
                  }
                }
                else if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
                  uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                  do {
                    uVar28 = uVar26;
                    uVar9 = (ulong)uVar28;
                    uVar26 = UF::P_[uVar9];
                    uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                  } while (UF::P_[uVar9] < uVar28);
                  do {
                    uVar26 = uVar15;
                    uVar30 = (ulong)uVar26;
                    uVar15 = UF::P_[uVar30];
                  } while (UF::P_[uVar30] < uVar26);
                  goto LAB_001913c0;
                }
              }
LAB_00191100:
              uVar7 = *(undefined4 *)(lVar23 + -8 + uVar11 * 4);
              goto LAB_00191105;
            }
            if (*(char *)((uVar11 - 2) + lVar20) == '\0') {
              if (*(char *)(lVar22 + uVar11) == '\0') {
                if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
                  uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                  do {
                    uVar28 = uVar26;
                    uVar9 = (ulong)uVar28;
                    uVar26 = UF::P_[uVar9];
                    uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                  } while (UF::P_[uVar9] < uVar28);
                  do {
                    uVar26 = uVar15;
                    uVar30 = (ulong)uVar26;
                    uVar15 = UF::P_[uVar30];
                  } while (UF::P_[uVar30] < uVar26);
                  goto LAB_001913c0;
                }
                if (*(char *)(lVar29 + uVar11) == '\0') {
                  uVar26 = *(uint *)(lVar27 + -8 + uVar11 * 4);
                  do {
                    uVar28 = uVar26;
                    uVar26 = UF::P_[uVar28];
                    uVar15 = *(uint *)(lVar27 + uVar11 * 4);
                  } while (UF::P_[uVar28] < uVar28);
                  do {
                    uVar26 = uVar15;
                    uVar15 = UF::P_[uVar26];
                  } while (UF::P_[uVar26] < uVar26);
                  if (uVar28 < uVar26) {
                    UF::P_[uVar26] = uVar28;
                    uVar26 = uVar28;
                  }
                  else {
                    UF::P_[uVar28] = uVar26;
                  }
                  do {
                    uVar15 = uVar26;
                    uVar9 = (ulong)uVar15;
                    uVar28 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                    uVar26 = puVar19[uVar9];
                  } while (puVar19[uVar9] < uVar15);
                  do {
                    uVar26 = uVar28;
                    uVar30 = (ulong)uVar26;
                    uVar28 = puVar19[uVar30];
                  } while (puVar19[uVar30] < uVar26);
                  goto LAB_00191365;
                }
                uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                do {
                  uVar28 = uVar26;
                  uVar26 = UF::P_[uVar28];
                  uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                } while (UF::P_[uVar28] < uVar28);
                do {
                  uVar26 = uVar15;
                  uVar30 = (ulong)uVar26;
                  uVar15 = UF::P_[uVar30];
                } while (UF::P_[uVar30] < uVar26);
                if (uVar28 < uVar26) {
LAB_00190944:
                  uVar26 = uVar28;
                  UF::P_[uVar30] = uVar26;
                }
                else {
                  UF::P_[uVar28] = uVar26;
                }
LAB_00190cde:
                *(uint *)(lVar23 + uVar11 * 4) = uVar26;
                goto LAB_00191109;
              }
              uVar26 = *(uint *)(lVar27 + uVar11 * 4);
              do {
                uVar28 = uVar26;
                uVar9 = (ulong)uVar28;
                uVar26 = UF::P_[uVar9];
                uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
              } while (UF::P_[uVar9] < uVar28);
              do {
                uVar26 = uVar15;
                uVar30 = (ulong)uVar26;
                uVar15 = UF::P_[uVar30];
              } while (UF::P_[uVar30] < uVar26);
            }
            else if (*(char *)(lVar22 + -1 + uVar11) == '\0') {
              if (*(char *)(lVar22 + -2 + uVar11) == '\0') {
                uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                do {
                  uVar28 = uVar26;
                  uVar9 = (ulong)uVar28;
                  uVar26 = UF::P_[uVar9];
                  uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                } while (UF::P_[uVar9] < uVar28);
                do {
                  uVar26 = uVar15;
                  uVar30 = (ulong)uVar26;
                  uVar15 = UF::P_[uVar30];
                } while (UF::P_[uVar30] < uVar26);
              }
              else if (*(char *)(lVar29 + -1 + uVar11) == '\0') {
                uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                do {
                  uVar28 = uVar26;
                  uVar9 = (ulong)uVar28;
                  uVar26 = UF::P_[uVar9];
                  uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                } while (UF::P_[uVar9] < uVar28);
                do {
                  uVar26 = uVar15;
                  uVar30 = (ulong)uVar26;
                  uVar15 = UF::P_[uVar30];
                } while (UF::P_[uVar30] < uVar26);
              }
              else {
                if ((*(char *)(lVar22 + uVar11) != '\0') || (*(char *)(lVar29 + uVar11) != '\0'))
                goto LAB_00191100;
                uVar26 = *(uint *)(lVar27 + uVar11 * 4);
                do {
                  uVar28 = uVar26;
                  uVar9 = (ulong)uVar28;
                  uVar26 = UF::P_[uVar9];
                  uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
                } while (UF::P_[uVar9] < uVar28);
                do {
                  uVar26 = uVar15;
                  uVar30 = (ulong)uVar26;
                  uVar15 = UF::P_[uVar30];
                } while (UF::P_[uVar30] < uVar26);
              }
            }
            else {
              if ((*(char *)(lVar22 + uVar11) != '\0') || (*(char *)(lVar29 + uVar11) != '\0'))
              goto LAB_00191100;
              uVar26 = *(uint *)(lVar27 + uVar11 * 4);
              do {
                uVar28 = uVar26;
                uVar9 = (ulong)uVar28;
                uVar26 = UF::P_[uVar9];
                uVar15 = *(uint *)(lVar23 + -8 + uVar11 * 4);
              } while (UF::P_[uVar9] < uVar28);
              do {
                uVar26 = uVar15;
                uVar30 = (ulong)uVar26;
                uVar15 = UF::P_[uVar30];
              } while (UF::P_[uVar30] < uVar26);
            }
LAB_00190cc6:
            if (uVar28 < uVar26) {
LAB_001913c4:
              uVar26 = uVar28;
              UF::P_[uVar30] = uVar26;
            }
            else {
              UF::P_[uVar9] = uVar26;
            }
LAB_001913d0:
            *(uint *)(lVar23 + uVar11 * 4) = uVar26;
          }
LAB_00191109:
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < lVar24);
      }
      puVar19 = UF::P_;
      uVar16 = uVar16 + 2;
    } while (uVar16 < uVar12);
    uVar15 = 1;
    if (1 < UF::length_) {
      uVar15 = 1;
      uVar12 = 1;
      do {
        if (puVar19[uVar12] < uVar12) {
          uVar26 = puVar19[puVar19[uVar12]];
        }
        else {
          uVar26 = uVar15;
          uVar15 = uVar15 + 1;
        }
        puVar19[uVar12] = uVar26;
        uVar12 = uVar12 + 1;
      } while (uVar12 < UF::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
  puVar19 = UF::P_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar26 = *(uint *)&pMVar5->field_0x8;
  uVar21 = uVar26 & 0xfffffffe;
  uVar15 = *(uint *)&pMVar5->field_0xc;
  local_e0 = uVar15 & 0x80000001;
  uVar16 = (long)(int)uVar15 & 0xfffffffffffffffe;
  uVar12 = 0;
  uVar28 = 0;
  iVar17 = (int)uVar16;
  if (0 < (int)uVar21) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar20 = *(long *)&pMVar4->field_0x10;
    lVar22 = **(long **)&pMVar4->field_0x48;
    lVar23 = *(long *)&pMVar5->field_0x10;
    lVar29 = **(long **)&pMVar5->field_0x48;
    lVar18 = lVar23 + lVar29;
    lVar27 = lVar20 + 1 + lVar22;
    lVar24 = lVar20 + 1;
    uVar12 = 0;
    lVar31 = lVar23;
    do {
      puVar6 = UF::P_;
      lVar32 = lVar29 * uVar12 + lVar23;
      lVar1 = lVar32 + lVar29;
      if (iVar17 < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        do {
          lVar25 = (long)*(int *)(lVar31 + uVar11 * 4);
          if (lVar25 < 1) {
            *(undefined8 *)(lVar31 + uVar11 * 4) = 0;
            uVar14 = uVar11 + 1;
            *(undefined4 *)(lVar18 + uVar11 * 4) = 0;
            uVar8 = 0;
          }
          else {
            uVar8 = puVar6[lVar25];
            uVar13 = uVar8;
            if (*(char *)(lVar24 + -1 + uVar11) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar31 + uVar11 * 4) = uVar13;
            uVar14 = uVar11 | 1;
            uVar13 = uVar8;
            if (*(char *)(lVar24 + uVar11) == '\0') {
              uVar13 = uVar28;
            }
            *(uint *)(lVar31 + 4 + uVar11 * 4) = uVar13;
            uVar13 = uVar8;
            if (*(char *)(lVar27 + -1 + uVar11) == '\0') {
              uVar13 = uVar28;
            }
            *(uint *)(lVar18 + uVar11 * 4) = uVar13;
            if (*(char *)(lVar27 + uVar11) == '\0') {
              uVar8 = uVar28;
            }
          }
          *(uint *)(lVar1 + uVar14 * 4) = uVar8;
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)uVar16);
      }
      if (local_e0 == 1) {
        lVar25 = (long)*(int *)(lVar32 + uVar11 * 4);
        if (lVar25 < 1) {
          *(undefined4 *)(lVar32 + uVar11 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar11 * 4) = 0;
        }
        else {
          lVar10 = lVar22 * uVar12 + lVar20;
          uVar8 = puVar19[lVar25];
          uVar13 = uVar8;
          if (*(char *)(lVar10 + uVar11) == '\0') {
            uVar13 = uVar28;
          }
          *(uint *)(lVar32 + uVar11 * 4) = uVar13;
          if (*(char *)(lVar10 + lVar22 + uVar11) == '\0') {
            *(undefined4 *)(lVar1 + uVar11 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar11 * 4) = uVar8;
          }
        }
      }
      uVar12 = uVar12 + 2;
      lVar18 = lVar18 + lVar29 * 2;
      lVar27 = lVar27 + lVar22 * 2;
      lVar24 = lVar24 + lVar22 * 2;
      lVar31 = lVar31 + lVar29 * 2;
    } while (uVar12 < uVar21);
    uVar12 = uVar12 & 0xffffffff;
  }
  puVar19 = UF::P_;
  if ((uVar26 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar24 = *(long *)&pMVar4->field_0x10;
    lVar20 = **(long **)&pMVar4->field_0x48 * uVar12;
    lVar18 = *(long *)&pMVar5->field_0x10;
    lVar27 = uVar12 * **(long **)&pMVar5->field_0x48;
    if (iVar17 < 1) {
      uVar12 = 0;
    }
    else {
      lVar22 = lVar20 + lVar24;
      lVar23 = lVar27 + lVar18;
      uVar12 = 0;
      do {
        lVar29 = (long)*(int *)(lVar23 + uVar12 * 4);
        if (lVar29 < 1) {
          *(undefined8 *)(lVar23 + uVar12 * 4) = 0;
        }
        else {
          uVar26 = puVar19[lVar29];
          uVar28 = uVar26;
          if (*(char *)(lVar22 + uVar12) == '\0') {
            uVar28 = 0;
          }
          *(uint *)(lVar23 + uVar12 * 4) = uVar28;
          if (*(char *)(lVar22 + 1 + uVar12) == '\0') {
            *(undefined4 *)(lVar23 + 4 + uVar12 * 4) = 0;
          }
          else {
            *(uint *)(lVar23 + 4 + uVar12 * 4) = uVar26;
          }
        }
        uVar12 = uVar12 + 2;
      } while (uVar12 < ((long)(int)uVar15 & 0xfffffffeU));
    }
    puVar19 = UF::P_;
    if (local_e0 == 1) {
      lVar18 = lVar18 + lVar27;
      lVar27 = (long)*(int *)(lVar18 + uVar12 * 4);
      if ((0 < lVar27) && (*(char *)(lVar24 + lVar20 + uVar12) != '\0')) {
        *(uint *)(lVar18 + uVar12 * 4) = UF::P_[lVar27];
        goto LAB_001917bc;
      }
      *(undefined4 *)(lVar18 + uVar12 * 4) = 0;
    }
  }
  puVar19 = UF::P_;
  if (UF::P_ == (uint *)0x0) {
    return;
  }
LAB_001917bc:
  operator_delete__(puVar19);
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }